

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checked.h
# Opt level: O1

back_insert_iterator<std::vector<char,_std::allocator<char>_>_>
utf8::append<std::back_insert_iterator<std::vector<char,std::allocator<char>>>>
          (uint32_t cp,back_insert_iterator<std::vector<char,_std::allocator<char>_>_> result)

{
  pointer *ppcVar1;
  undefined8 *puVar2;
  byte *__args;
  byte bVar3;
  iterator iVar4;
  byte local_1a;
  byte local_19;
  byte local_18;
  byte local_17;
  byte local_16;
  byte local_15;
  byte local_14;
  byte local_13;
  byte local_12;
  byte local_11;
  
  if ((0x10ffff < cp) || ((cp & 0xfffff800) == 0xd800)) {
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    *puVar2 = &PTR__exception_00908f78;
    *(uint32_t *)(puVar2 + 1) = cp;
    __cxa_throw(puVar2,&invalid_code_point::typeinfo,std::exception::~exception);
  }
  bVar3 = (byte)cp;
  if (cp < 0x80) {
    iVar4._M_current =
         ((result.container)->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar4._M_current !=
        ((result.container)->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) goto LAB_003979ed;
    __args = &local_11;
    local_11 = bVar3;
  }
  else if (cp < 0x800) {
    local_12 = (byte)(cp >> 6) | 0xc0;
    iVar4._M_current =
         ((result.container)->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar4._M_current ==
        ((result.container)->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<char,_std::allocator<char>_>::_M_realloc_insert<char>
                (result.container,iVar4,(char *)&local_12);
    }
    else {
      *iVar4._M_current = local_12;
      ppcVar1 = &((result.container)->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppcVar1 = *ppcVar1 + 1;
    }
    local_13 = bVar3 & 0x3f | 0x80;
    cp = (uint32_t)local_13;
    iVar4._M_current =
         ((result.container)->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar4._M_current !=
        ((result.container)->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) goto LAB_003979ed;
    __args = &local_13;
  }
  else if (cp < 0x10000) {
    local_14 = (byte)(cp >> 0xc) | 0xe0;
    iVar4._M_current =
         ((result.container)->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar4._M_current ==
        ((result.container)->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<char,_std::allocator<char>_>::_M_realloc_insert<char>
                (result.container,iVar4,(char *)&local_14);
    }
    else {
      *iVar4._M_current = local_14;
      ppcVar1 = &((result.container)->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppcVar1 = *ppcVar1 + 1;
    }
    local_15 = (byte)(cp >> 6) & 0x3f | 0x80;
    iVar4._M_current =
         ((result.container)->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar4._M_current ==
        ((result.container)->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<char,_std::allocator<char>_>::_M_realloc_insert<char>
                (result.container,iVar4,(char *)&local_15);
    }
    else {
      *iVar4._M_current = local_15;
      ppcVar1 = &((result.container)->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppcVar1 = *ppcVar1 + 1;
    }
    local_16 = bVar3 & 0x3f | 0x80;
    cp = (uint32_t)local_16;
    iVar4._M_current =
         ((result.container)->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar4._M_current !=
        ((result.container)->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
LAB_003979ed:
      *iVar4._M_current = (char)cp;
      ppcVar1 = &((result.container)->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppcVar1 = *ppcVar1 + 1;
      return (back_insert_iterator<std::vector<char,_std::allocator<char>_>_>)
             (back_insert_iterator<std::vector<char,_std::allocator<char>_>_>)result.container;
    }
    __args = &local_16;
  }
  else {
    local_17 = (byte)(cp >> 0x12) | 0xf0;
    iVar4._M_current =
         ((result.container)->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar4._M_current ==
        ((result.container)->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<char,_std::allocator<char>_>::_M_realloc_insert<char>
                (result.container,iVar4,(char *)&local_17);
    }
    else {
      *iVar4._M_current = local_17;
      ppcVar1 = &((result.container)->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppcVar1 = *ppcVar1 + 1;
    }
    local_18 = (byte)(cp >> 0xc) & 0x3f | 0x80;
    iVar4._M_current =
         ((result.container)->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar4._M_current ==
        ((result.container)->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<char,_std::allocator<char>_>::_M_realloc_insert<char>
                (result.container,iVar4,(char *)&local_18);
    }
    else {
      *iVar4._M_current = local_18;
      ppcVar1 = &((result.container)->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppcVar1 = *ppcVar1 + 1;
    }
    local_19 = (byte)(cp >> 6) & 0x3f | 0x80;
    iVar4._M_current =
         ((result.container)->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar4._M_current ==
        ((result.container)->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<char,_std::allocator<char>_>::_M_realloc_insert<char>
                (result.container,iVar4,(char *)&local_19);
    }
    else {
      *iVar4._M_current = local_19;
      ppcVar1 = &((result.container)->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppcVar1 = *ppcVar1 + 1;
    }
    local_1a = bVar3 & 0x3f | 0x80;
    cp = (uint32_t)local_1a;
    iVar4._M_current =
         ((result.container)->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar4._M_current !=
        ((result.container)->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) goto LAB_003979ed;
    __args = &local_1a;
  }
  std::vector<char,_std::allocator<char>_>::_M_realloc_insert<char>
            (result.container,iVar4,(char *)__args);
  return (back_insert_iterator<std::vector<char,_std::allocator<char>_>_>)
         (back_insert_iterator<std::vector<char,_std::allocator<char>_>_>)result.container;
}

Assistant:

octet_iterator append(uint32_t cp, octet_iterator result)
    {
        if (!utf8::internal::is_code_point_valid(cp))
            throw invalid_code_point(cp);

        if (cp < 0x80)                        // one octet
            *(result++) = static_cast<uint8_t>(cp);
        else if (cp < 0x800) {                // two octets
            *(result++) = static_cast<uint8_t>((cp >> 6)            | 0xc0);
            *(result++) = static_cast<uint8_t>((cp & 0x3f)          | 0x80);
        }
        else if (cp < 0x10000) {              // three octets
            *(result++) = static_cast<uint8_t>((cp >> 12)           | 0xe0);
            *(result++) = static_cast<uint8_t>(((cp >> 6) & 0x3f)   | 0x80);
            *(result++) = static_cast<uint8_t>((cp & 0x3f)          | 0x80);
        }
        else {                                // four octets
            *(result++) = static_cast<uint8_t>((cp >> 18)           | 0xf0);
            *(result++) = static_cast<uint8_t>(((cp >> 12) & 0x3f)  | 0x80);
            *(result++) = static_cast<uint8_t>(((cp >> 6) & 0x3f)   | 0x80);
            *(result++) = static_cast<uint8_t>((cp & 0x3f)          | 0x80);
        }
        return result;
    }